

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O1

CompressionResult __thiscall
duckdb::TemporaryFileManager::CompressBuffer
          (TemporaryFileManager *this,TemporaryFileCompressionAdaptivity *compression_adaptivity,
          FileBuffer *buffer,AllocatedData *compressed_buffer)

{
  TemporaryCompressionLevel compressionLevel;
  size_t sVar1;
  Allocator *this_00;
  data_ptr_t pointer;
  TemporaryCompressionLevel TVar2;
  ulong uVar3;
  CompressionResult CVar4;
  AllocatedData local_48;
  
  uVar3 = 0x40000;
  TVar2 = UNCOMPRESSED;
  if ((0x8000 < buffer->internal_size) &&
     (compressionLevel =
           TemporaryFileCompressionAdaptivity::GetCompressionLevel(compression_adaptivity),
     TVar2 = UNCOMPRESSED, compressionLevel != UNCOMPRESSED)) {
    sVar1 = duckdb_zstd::ZSTD_compressBound(buffer->internal_size);
    this_00 = Allocator::Get(this->db);
    pointer = Allocator::AllocateData(this_00,sVar1 + 8);
    AllocatedData::AllocatedData(&local_48,this_00,pointer,sVar1 + 8);
    AllocatedData::operator=(compressed_buffer,&local_48);
    AllocatedData::~AllocatedData(&local_48);
    sVar1 = duckdb_zstd::ZSTD_compress
                      (compressed_buffer->pointer + 8,sVar1,buffer->internal_buffer,
                       buffer->internal_size,compressionLevel);
    *(size_t *)compressed_buffer->pointer = sVar1;
    uVar3 = 0x40000;
    TVar2 = compressionLevel;
    if (0xfffffffffffc7ffe < sVar1 - 0x37ff9) {
      uVar3 = sVar1 + 0x8007 & 0xffffffffffff8000;
    }
  }
  CVar4.level = TVar2;
  CVar4.size = uVar3;
  CVar4._12_4_ = 0;
  return CVar4;
}

Assistant:

TemporaryFileManager::CompressionResult
TemporaryFileManager::CompressBuffer(TemporaryFileCompressionAdaptivity &compression_adaptivity, FileBuffer &buffer,
                                     AllocatedData &compressed_buffer) {
	if (buffer.AllocSize() <= TemporaryBufferSizeToSize(MinimumCompressedTemporaryBufferSize())) {
		// Buffer size is less or equal to the minimum compressed size - no point compressing
		return {TemporaryBufferSize::DEFAULT, TemporaryCompressionLevel::UNCOMPRESSED};
	}

	const auto level = compression_adaptivity.GetCompressionLevel();
	if (level == TemporaryCompressionLevel::UNCOMPRESSED) {
		return {TemporaryBufferSize::DEFAULT, TemporaryCompressionLevel::UNCOMPRESSED};
	}

	const auto compression_level = static_cast<int>(level);
	D_ASSERT(compression_level >= duckdb_zstd::ZSTD_minCLevel() && compression_level <= duckdb_zstd::ZSTD_maxCLevel());
	const auto zstd_bound = duckdb_zstd::ZSTD_compressBound(buffer.AllocSize());
	compressed_buffer = Allocator::Get(db).Allocate(sizeof(idx_t) + zstd_bound);
	const auto zstd_size = duckdb_zstd::ZSTD_compress(compressed_buffer.get() + sizeof(idx_t), zstd_bound,
	                                                  buffer.InternalBuffer(), buffer.AllocSize(), compression_level);
	D_ASSERT(!duckdb_zstd::ZSTD_isError(zstd_size));
	Store<idx_t>(zstd_size, compressed_buffer.get());
	const auto compressed_size = sizeof(idx_t) + zstd_size;

	if (compressed_size > TemporaryBufferSizeToSize(MaximumCompressedTemporaryBufferSize())) {
		return {TemporaryBufferSize::DEFAULT, level}; // Use default size if compression ratio is bad
	}

	return {RoundUpSizeToTemporaryBufferSize(compressed_size), level};
}